

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O1

bool trt_pose::parse::munkresStep2(PairGraph *star_graph,CoverTable *cover_table)

{
  ulong *puVar1;
  int iVar2;
  pointer piVar3;
  _Bit_type *p_Var4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  iVar2 = star_graph->nrows;
  iVar6 = star_graph->ncols;
  if ((long)iVar6 < 1) {
    iVar7 = 0;
  }
  else {
    piVar3 = (star_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var4 = (cover_table->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar5 = 0;
    iVar7 = 0;
    do {
      if (-1 < piVar3[uVar5]) {
        puVar1 = p_Var4 + (uVar5 >> 6);
        *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
        iVar7 = iVar7 + 1;
      }
      uVar5 = uVar5 + 1;
    } while ((long)iVar6 != uVar5);
  }
  if (iVar2 < iVar6) {
    iVar6 = iVar2;
  }
  return iVar6 <= iVar7;
}

Assistant:

bool munkresStep2(const PairGraph &star_graph, CoverTable &cover_table) {
  int k =
      star_graph.nrows < star_graph.ncols ? star_graph.nrows : star_graph.ncols;
  int count = 0;
  for (int j = 0; j < star_graph.ncols; j++) {
    if (star_graph.isColSet(j)) {
      cover_table.coverCol(j);
      count++;
    }
  }
  return count >= k;
}